

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

shared_ptr<evp_pkey_st> __thiscall
jwt::helper::load_public_key_from_string(helper *this,string *key,string *password)

{
  bool bVar1;
  int iVar2;
  BIO_METHOD *type;
  BIO *pBVar3;
  void *pvVar4;
  rsa_exception *prVar5;
  EVP_PKEY *__p;
  ulong e;
  char *__s;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<evp_pkey_st> sVar6;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_91;
  int local_90;
  int local_8c;
  int len_1;
  int len;
  string epkey;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _func_void_bio_st_ptr *local_38;
  undefined1 local_30 [8];
  unique_ptr<bio_st,_void_(*)(bio_st_*)> pubkey_bio;
  string *password_local;
  string *key_local;
  shared_ptr<evp_pkey_st> *pkey;
  
  pubkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (bio_st *)password;
  type = BIO_s_mem();
  pBVar3 = BIO_new(type);
  local_38 = BIO_free_all;
  std::unique_ptr<bio_st,void(*)(bio_st*)>::unique_ptr<void(*)(bio_st*),void>
            ((unique_ptr<bio_st,void(*)(bio_st*)> *)local_30,(pointer)pBVar3,&local_38);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)key);
  bVar1 = std::operator==(&local_58,"-----BEGIN CERTIFICATE-----");
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    extract_pubkey_from_cert
              ((string *)&len_1,key,
               (string *)
               pubkey_bio._M_t.super___uniq_ptr_impl<bio_st,_void_(*)(bio_st_*)>._M_t.
               super__Tuple_impl<0UL,_bio_st_*,_void_(*)(bio_st_*)>.
               super__Head_base<0UL,_bio_st_*,_false>._M_head_impl);
    local_8c = std::__cxx11::string::size();
    pBVar3 = (BIO *)std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::get
                              ((unique_ptr<bio_st,_void_(*)(bio_st_*)> *)local_30);
    pvVar4 = (void *)std::__cxx11::string::data();
    iVar2 = BIO_write(pBVar3,pvVar4,local_8c);
    if (iVar2 != local_8c) {
      prVar5 = (rsa_exception *)__cxa_allocate_exception(0x10);
      rsa_exception::rsa_exception(prVar5,"failed to load public key: bio_write failed");
      __cxa_throw(prVar5,&rsa_exception::typeinfo,rsa_exception::~rsa_exception);
    }
    std::__cxx11::string::~string((string *)&len_1);
  }
  else {
    local_90 = std::__cxx11::string::size();
    pBVar3 = (BIO *)std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::get
                              ((unique_ptr<bio_st,_void_(*)(bio_st_*)> *)local_30);
    pvVar4 = (void *)std::__cxx11::string::data();
    iVar2 = BIO_write(pBVar3,pvVar4,local_90);
    if (iVar2 != local_90) {
      prVar5 = (rsa_exception *)__cxa_allocate_exception(0x10);
      rsa_exception::rsa_exception(prVar5,"failed to load public key: bio_write failed");
      __cxa_throw(prVar5,&rsa_exception::typeinfo,rsa_exception::~rsa_exception);
    }
  }
  local_91 = 0;
  pBVar3 = (BIO *)std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::get
                            ((unique_ptr<bio_st,_void_(*)(bio_st_*)> *)local_30);
  pvVar4 = (void *)std::__cxx11::string::c_str();
  __p = PEM_read_bio_PUBKEY(pBVar3,(EVP_PKEY **)0x0,(undefined1 *)0x0,pvVar4);
  std::shared_ptr<evp_pkey_st>::shared_ptr<evp_pkey_st,void(*)(evp_pkey_st*),void>
            ((shared_ptr<evp_pkey_st> *)this,(evp_pkey_st *)__p,EVP_PKEY_free);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar1) {
    prVar5 = (rsa_exception *)__cxa_allocate_exception(0x10);
    e = ERR_get_error();
    __s = ERR_error_string(e,(char *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_d9);
    std::operator+(&local_b8,"failed to load public key: PEM_read_bio_PUBKEY failed:",&local_d8);
    rsa_exception::rsa_exception(prVar5,&local_b8);
    __cxa_throw(prVar5,&rsa_exception::typeinfo,rsa_exception::~rsa_exception);
  }
  local_91 = 1;
  std::unique_ptr<bio_st,_void_(*)(bio_st_*)>::~unique_ptr
            ((unique_ptr<bio_st,_void_(*)(bio_st_*)> *)local_30);
  sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<evp_pkey_st>)sVar6.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline
		std::shared_ptr<EVP_PKEY> load_public_key_from_string(const std::string& key, const std::string& password = "") {
			std::unique_ptr<BIO, decltype(&BIO_free_all)> pubkey_bio(BIO_new(BIO_s_mem()), BIO_free_all);
			if(key.substr(0, 27) == "-----BEGIN CERTIFICATE-----") {
				auto epkey = helper::extract_pubkey_from_cert(key, password);
				const int len = static_cast<int>(epkey.size());
				if (BIO_write(pubkey_bio.get(), epkey.data(), len) != len)
					throw rsa_exception("failed to load public key: bio_write failed");
			} else {
				const int len = static_cast<int>(key.size());
				if (BIO_write(pubkey_bio.get(), key.data(), len) != len)
					throw rsa_exception("failed to load public key: bio_write failed");
			}
			
			std::shared_ptr<EVP_PKEY> pkey(PEM_read_bio_PUBKEY(pubkey_bio.get(), nullptr, nullptr, (void*)password.c_str()), EVP_PKEY_free);
			if (!pkey)
				throw rsa_exception("failed to load public key: PEM_read_bio_PUBKEY failed:" + std::string(ERR_error_string(ERR_get_error(), NULL)));
			return pkey;
		}